

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::parse<int,int,int>(semver *this,string_view str,range_set<int,_int,_int> *out)

{
  string_view text;
  bool bVar1;
  from_chars_result fVar2;
  token_stream local_d0;
  range_parser local_b0;
  undefined4 local_8c;
  semver *local_88;
  char *local_80;
  lexer local_78;
  undefined1 local_60 [8];
  from_chars_result result;
  token_stream token_stream;
  range_set<int,_int,_int> *out_local;
  string_view str_local;
  errc local_10;
  
  detail::token_stream::token_stream((token_stream *)&result.super_from_chars_result.ec);
  text._M_str = (char *)str._M_len;
  text._M_len = (size_t)this;
  local_88 = this;
  local_80 = (char *)str._M_len;
  detail::lexer::lexer(&local_78,text);
  fVar2 = detail::lexer::scan_tokens(&local_78,(token_stream *)&result.super_from_chars_result.ec);
  local_60 = (undefined1  [8])fVar2.super_from_chars_result.ptr;
  result.super_from_chars_result.ptr._0_4_ = fVar2.super_from_chars_result.ec;
  bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_60);
  if (bVar1) {
    detail::token_stream::token_stream(&local_d0,(token_stream *)&result.super_from_chars_result.ec)
    ;
    detail::range_parser::range_parser(&local_b0,&local_d0);
    fVar2 = detail::range_parser::parse<int,int,int>
                      (&local_b0,(range_set<int,_int,_int> *)str._M_str);
    str_local._M_str = fVar2.super_from_chars_result.ptr;
    local_10 = fVar2.super_from_chars_result.ec;
    detail::range_parser::~range_parser(&local_b0);
    detail::token_stream::~token_stream(&local_d0);
  }
  else {
    str_local._M_str = (char *)local_60;
    local_10 = (errc)result.super_from_chars_result.ptr;
  }
  local_8c = 1;
  detail::token_stream::~token_stream((token_stream *)&result.super_from_chars_result.ec);
  fVar2.super_from_chars_result.ec = local_10;
  fVar2.super_from_chars_result.ptr = str_local._M_str;
  fVar2.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar2.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, range_set<I1, I2, I3>& out) {
  detail::token_stream token_stream;
  const from_chars_result result =  detail::lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  return detail::range_parser{ std::move(token_stream) }.parse(out);
}